

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestPartResult
          (PrettyUnitTestResultPrinter *this,TestPartResult *result)

{
  Type TVar1;
  TestPartResult *in_RSI;
  TestPartResult *in_stack_00000020;
  
  TVar1 = TestPartResult::type(in_RSI);
  if (TVar1 != kSuccess) {
    PrintTestPartResult(in_stack_00000020);
    fflush(_stdout);
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestPartResult(
    const TestPartResult& result) {
  // If the test part succeeded, we don't need to do anything.
  if (result.type() == TestPartResult::kSuccess)
    return;

  // Print failure message from the assertion (e.g. expected this and got that).
  PrintTestPartResult(result);
  fflush(stdout);
}